

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_sPLT(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  ushort *puVar1;
  byte *pbVar2;
  ushort uVar3;
  png_uint_32 pVar4;
  ulong uVar5;
  int iVar6;
  ushort *buf;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ushort *puVar10;
  png_sPLT_t new_palette;
  png_sPLT_t local_48;
  
  pVar4 = png_ptr->user_chunk_cache_max;
  if (pVar4 == 0) {
LAB_00119acf:
    if ((png_ptr->mode & 1) == 0) {
      png_chunk_error(png_ptr,"missing IHDR");
    }
    if ((png_ptr->mode & 4) == 0) {
      buf = (ushort *)png_read_buffer(png_ptr,(ulong)(length + 1),2);
      if (buf != (ushort *)0x0) {
        png_crc_read(png_ptr,(png_bytep)buf,length);
        iVar6 = png_crc_finish(png_ptr,0);
        if (iVar6 != 0) {
          return;
        }
        *(undefined1 *)((long)buf + (ulong)length) = 0;
        iVar6 = 1;
        puVar1 = buf;
        do {
          puVar10 = puVar1;
          iVar6 = iVar6 + 1;
          puVar1 = (ushort *)((long)puVar10 + 1);
        } while ((char)*puVar10 != '\0');
        if ((length < 2) || ((ushort *)((long)buf + (ulong)(length - 2)) < puVar1)) {
          pcVar8 = "malformed sPLT chunk";
        }
        else {
          local_48.depth = *(png_byte *)puVar1;
          uVar7 = (uint)(local_48.depth != '\b') * 4 + 6;
          uVar5 = (ulong)(length - iVar6) / (ulong)uVar7;
          if ((length - iVar6) % uVar7 == 0) {
            local_48.nentries = (png_int_32)uVar5;
            local_48.entries = (png_sPLT_entryp)png_malloc_warn(png_ptr,uVar5 * 10);
            if (local_48.entries != (png_sPLT_entryp)0x0) {
              if (0 < (long)local_48.nentries) {
                lVar9 = 0;
                do {
                  if (local_48.depth == '\b') {
                    *(ushort *)((long)&(local_48.entries)->red + lVar9) = (ushort)(byte)puVar10[1];
                    *(ushort *)((long)&(local_48.entries)->green + lVar9) =
                         (ushort)*(byte *)((long)puVar10 + 3);
                    *(ushort *)((long)&(local_48.entries)->blue + lVar9) = (ushort)(byte)puVar10[2];
                    pbVar2 = (byte *)((long)puVar10 + 5);
                    puVar10 = puVar10 + 3;
                    *(ushort *)((long)&(local_48.entries)->alpha + lVar9) = (ushort)*pbVar2;
                  }
                  else {
                    uVar3 = puVar10[1];
                    *(ushort *)((long)&(local_48.entries)->red + lVar9) = uVar3 << 8 | uVar3 >> 8;
                    *(ushort *)((long)&(local_48.entries)->green + lVar9) =
                         puVar10[2] << 8 | puVar10[2] >> 8;
                    *(ushort *)((long)&(local_48.entries)->blue + lVar9) =
                         puVar10[3] << 8 | puVar10[3] >> 8;
                    *(ushort *)((long)&(local_48.entries)->alpha + lVar9) =
                         puVar10[4] << 8 | puVar10[4] >> 8;
                    puVar10 = puVar10 + 5;
                  }
                  *(ushort *)((long)&(local_48.entries)->frequency + lVar9) =
                       *puVar10 << 8 | *puVar10 >> 8;
                  lVar9 = lVar9 + 10;
                } while ((long)local_48.nentries * 10 != lVar9);
              }
              local_48.name = (png_charp)buf;
              png_set_sPLT(png_ptr,info_ptr,&local_48,1);
              png_free(png_ptr,local_48.entries);
              return;
            }
            pcVar8 = "sPLT chunk requires too much memory";
            local_48.entries = (png_sPLT_entryp)0x0;
          }
          else {
            pcVar8 = "sPLT chunk has bad length";
          }
        }
        png_warning(png_ptr,pcVar8);
        return;
      }
      png_crc_finish(png_ptr,length);
      pcVar8 = "out of memory";
    }
    else {
      png_crc_finish(png_ptr,length);
      pcVar8 = "out of place";
    }
    png_chunk_benign_error(png_ptr,pcVar8);
    return;
  }
  if (pVar4 != 1) {
    png_ptr->user_chunk_cache_max = pVar4 - 1;
    if (pVar4 - 1 != 1) goto LAB_00119acf;
    png_warning(png_ptr,"No space in chunk cache for sPLT");
  }
  png_crc_finish(png_ptr,length);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_sPLT(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
/* Note: this does not properly handle chunks that are > 64K under DOS */
{
   png_bytep entry_start, buffer;
   png_sPLT_t new_palette;
   png_sPLT_entryp pp;
   png_uint_32 data_length;
   int entry_size, i;
   png_uint_32 skip = 0;
   png_uint_32 dl;
   size_t max_dl;

   png_debug(1, "in png_handle_sPLT");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_warning(png_ptr, "No space in chunk cache for sPLT");
         png_crc_finish(png_ptr, length);
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

#ifdef PNG_MAX_MALLOC_64K
   if (length > 65535U)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "too large to fit in memory");
      return;
   }
#endif

   buffer = png_read_buffer(png_ptr, length+1, 2/*silent*/);
   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }


   /* WARNING: this may break if size_t is less than 32 bits; it is assumed
    * that the PNG_MAX_MALLOC_64K test is enabled in this case, but this is a
    * potential breakage point if the types in pngconf.h aren't exactly right.
    */
   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, skip) != 0)
      return;

   buffer[length] = 0;

   for (entry_start = buffer; *entry_start; entry_start++)
      /* Empty loop to find end of name */ ;

   ++entry_start;

   /* A sample depth should follow the separator, and we should be on it  */
   if (length < 2U || entry_start > buffer + (length - 2U))
   {
      png_warning(png_ptr, "malformed sPLT chunk");
      return;
   }

   new_palette.depth = *entry_start++;
   entry_size = (new_palette.depth == 8 ? 6 : 10);
   /* This must fit in a png_uint_32 because it is derived from the original
    * chunk data length.
    */
   data_length = length - (png_uint_32)(entry_start - buffer);

   /* Integrity-check the data length */
   if ((data_length % (unsigned int)entry_size) != 0)
   {
      png_warning(png_ptr, "sPLT chunk has bad length");
      return;
   }

   dl = (png_uint_32)(data_length / (unsigned int)entry_size);
   max_dl = PNG_SIZE_MAX / (sizeof (png_sPLT_entry));

   if (dl > max_dl)
   {
      png_warning(png_ptr, "sPLT chunk too long");
      return;
   }

   new_palette.nentries = (png_int_32)(data_length / (unsigned int)entry_size);

   new_palette.entries = (png_sPLT_entryp)png_malloc_warn(png_ptr,
       (png_alloc_size_t) new_palette.nentries * (sizeof (png_sPLT_entry)));

   if (new_palette.entries == NULL)
   {
      png_warning(png_ptr, "sPLT chunk requires too much memory");
      return;
   }

#ifdef PNG_POINTER_INDEXING_SUPPORTED
   for (i = 0; i < new_palette.nentries; i++)
   {
      pp = new_palette.entries + i;

      if (new_palette.depth == 8)
      {
         pp->red = *entry_start++;
         pp->green = *entry_start++;
         pp->blue = *entry_start++;
         pp->alpha = *entry_start++;
      }

      else
      {
         pp->red   = png_get_uint_16(entry_start); entry_start += 2;
         pp->green = png_get_uint_16(entry_start); entry_start += 2;
         pp->blue  = png_get_uint_16(entry_start); entry_start += 2;
         pp->alpha = png_get_uint_16(entry_start); entry_start += 2;
      }

      pp->frequency = png_get_uint_16(entry_start); entry_start += 2;
   }
#else
   pp = new_palette.entries;

   for (i = 0; i < new_palette.nentries; i++)
   {

      if (new_palette.depth == 8)
      {
         pp[i].red   = *entry_start++;
         pp[i].green = *entry_start++;
         pp[i].blue  = *entry_start++;
         pp[i].alpha = *entry_start++;
      }

      else
      {
         pp[i].red   = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].green = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].blue  = png_get_uint_16(entry_start); entry_start += 2;
         pp[i].alpha = png_get_uint_16(entry_start); entry_start += 2;
      }

      pp[i].frequency = png_get_uint_16(entry_start); entry_start += 2;
   }
#endif

   /* Discard all chunk data except the name and stash that */
   new_palette.name = (png_charp)buffer;

   png_set_sPLT(png_ptr, info_ptr, &new_palette, 1);

   png_free(png_ptr, new_palette.entries);
}